

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

void __thiscall
TreeIncPruneBGPlanner::TreeIncPruneBGPlanner
          (TreeIncPruneBGPlanner *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffa0;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *in_stack_ffffffffffffffa8;
  MonahanBGPlanner *in_stack_ffffffffffffffb0;
  
  MonahanBGPlanner::MonahanBGPlanner
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  *in_RDI = &PTR__TreeIncPruneBGPlanner_00d106d8;
  in_RDI[0x32] = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
         *)0x9421c5);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9421db);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9421f1);
  *(undefined1 *)((long)in_RDI + 0x214) = 1;
  *(undefined1 *)((long)in_RDI + 0x215) = 1;
  *(undefined1 *)((long)in_RDI + 0x216) = 1;
  in_RDI[0x43] = 0;
  in_RDI[0x44] = 0;
  *(undefined1 (*) [16])(in_RDI + 0x45) = (undefined1  [16])0x0;
  in_RDI[0x47] = 0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x942252);
  in_RDI[0x48] = 0;
  in_RDI[0x49] = 0;
  in_RDI[0x4a] = 0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x942284);
  Timing::Timing((Timing *)0x0);
  return;
}

Assistant:

TreeIncPruneBGPlanner::TreeIncPruneBGPlanner(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu) :
    MonahanBGPlanner(pu),
    _m_Gaoa(0),
    _m_pruneAfterUnion(true),
    _m_pruneAfterCrossSum(true),
    _m_useVectorCache(true),
    _m_cacheHit(0),
    _m_cacheMiss(0),
    _m_pruneAfterUnionStats(),
    _m_pruneAfterCrossSumStats()
{
}